

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O0

void png_do_write_swap_alpha(png_row_infop row_info,png_bytep row)

{
  png_byte pVar1;
  png_byte pVar2;
  uint uVar3;
  png_byte *ppVar4;
  png_bytep ppVar5;
  uint uStack_8c;
  png_byte save_3 [2];
  png_uint_32 row_width_3;
  png_uint_32 i_3;
  png_bytep dp_3;
  png_bytep sp_3;
  uint uStack_6c;
  png_byte save_2;
  png_uint_32 row_width_2;
  png_uint_32 i_2;
  png_bytep dp_2;
  png_bytep sp_2;
  uint uStack_4c;
  png_byte save_1 [2];
  png_uint_32 row_width_1;
  png_uint_32 i_1;
  png_bytep dp_1;
  png_bytep sp_1;
  uint uStack_2c;
  png_byte save;
  png_uint_32 row_width;
  png_uint_32 i;
  png_bytep dp;
  png_bytep sp;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (row_info->color_type == '\x06') {
    if (row_info->bit_depth == '\b') {
      uVar3 = row_info->width;
      _row_width = row;
      dp = row;
      for (uStack_2c = 0; uStack_2c < uVar3; uStack_2c = uStack_2c + 1) {
        pVar1 = *dp;
        *_row_width = dp[1];
        ppVar4 = dp + 3;
        _row_width[1] = dp[2];
        dp = dp + 4;
        ppVar5 = _row_width + 3;
        _row_width[2] = *ppVar4;
        _row_width = _row_width + 4;
        *ppVar5 = pVar1;
      }
    }
    else {
      uVar3 = row_info->width;
      _row_width_1 = row;
      dp_1 = row;
      for (uStack_4c = 0; uStack_4c < uVar3; uStack_4c = uStack_4c + 1) {
        pVar1 = *dp_1;
        pVar2 = dp_1[1];
        *_row_width_1 = dp_1[2];
        _row_width_1[1] = dp_1[3];
        _row_width_1[2] = dp_1[4];
        _row_width_1[3] = dp_1[5];
        ppVar4 = dp_1 + 7;
        _row_width_1[4] = dp_1[6];
        dp_1 = dp_1 + 8;
        _row_width_1[5] = *ppVar4;
        ppVar5 = _row_width_1 + 7;
        _row_width_1[6] = pVar1;
        _row_width_1 = _row_width_1 + 8;
        *ppVar5 = pVar2;
      }
    }
  }
  else if (row_info->color_type == '\x04') {
    if (row_info->bit_depth == '\b') {
      uVar3 = row_info->width;
      _row_width_2 = row;
      dp_2 = row;
      for (uStack_6c = 0; uStack_6c < uVar3; uStack_6c = uStack_6c + 1) {
        ppVar4 = dp_2 + 1;
        pVar1 = *dp_2;
        dp_2 = dp_2 + 2;
        ppVar5 = _row_width_2 + 1;
        *_row_width_2 = *ppVar4;
        _row_width_2 = _row_width_2 + 2;
        *ppVar5 = pVar1;
      }
    }
    else {
      uVar3 = row_info->width;
      _row_width_3 = row;
      dp_3 = row;
      for (uStack_8c = 0; uStack_8c < uVar3; uStack_8c = uStack_8c + 1) {
        pVar1 = *dp_3;
        pVar2 = dp_3[1];
        ppVar4 = dp_3 + 3;
        *_row_width_3 = dp_3[2];
        dp_3 = dp_3 + 4;
        _row_width_3[1] = *ppVar4;
        ppVar5 = _row_width_3 + 3;
        _row_width_3[2] = pVar1;
        _row_width_3 = _row_width_3 + 4;
        *ppVar5 = pVar2;
      }
    }
  }
  return;
}

Assistant:

static void
png_do_write_swap_alpha(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_write_swap_alpha");

   {
      if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This converts from ARGB to RGBA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               png_byte save = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = save;
            }
         }

#ifdef PNG_WRITE_16BIT_SUPPORTED
         else
         {
            /* This converts from AARRGGBB to RRGGBBAA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               png_byte save[2];
               save[0] = *(sp++);
               save[1] = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = save[0];
               *(dp++) = save[1];
            }
         }
#endif /* WRITE_16BIT */
      }

      else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This converts from AG to GA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               png_byte save = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = save;
            }
         }

#ifdef PNG_WRITE_16BIT_SUPPORTED
         else
         {
            /* This converts from AAGG to GGAA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               png_byte save[2];
               save[0] = *(sp++);
               save[1] = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = save[0];
               *(dp++) = save[1];
            }
         }
#endif /* WRITE_16BIT */
      }
   }
}